

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool __thiscall
picojson::default_parse_context::
parse_array_item<std::istreambuf_iterator<char,std::char_traits<char>>>
          (default_parse_context *this,
          input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in,size_t param_2)

{
  bool bVar1;
  array *this_00;
  reference out;
  default_parse_context local_50;
  default_parse_context ctx;
  value local_38;
  array *local_28;
  array *a;
  size_t param_2_local;
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in_local;
  default_parse_context *this_local;
  
  a = (array *)param_2;
  param_2_local = (size_t)in;
  in_local = (input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)this;
  this_00 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                      (this->out_);
  local_28 = this_00;
  picojson::value::value(&local_38);
  std::vector<picojson::value,_std::allocator<picojson::value>_>::push_back(this_00,&local_38);
  picojson::value::~value(&local_38);
  out = std::vector<picojson::value,_std::allocator<picojson::value>_>::back(local_28);
  default_parse_context(&local_50,out);
  bVar1 = _parse<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
                    (&local_50,
                     (input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                     param_2_local);
  return bVar1;
}

Assistant:

bool parse_array_item(input<Iter>& in, size_t) {
      array& a = out_->get<array>();
      a.push_back(value());
      default_parse_context ctx(&a.back());
      return _parse(ctx, in);
    }